

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_codegen.c
# Opt level: O2

gravity_class_t * context_get_class(gvisitor_t *self)

{
  gravity_class_t *pgVar1;
  ulong uVar2;
  
  uVar2 = (ulong)*self->data;
  do {
    if ((int)uVar2 < 1) {
      return (gravity_class_t *)0x0;
    }
    pgVar1 = *(gravity_class_t **)(*(long *)((long)self->data + 0x10) + -8 + uVar2 * 8);
    uVar2 = uVar2 - 1;
  } while (pgVar1->isa != gravity_class_class);
  return pgVar1;
}

Assistant:

static gravity_class_t *context_get_class (gvisitor_t *self) {
    gravity_object_r ctx = ((codegen_t *)self->data)->context;
    size_t len = marray_size(ctx);
    
    for (int i=(int)len-1; i>=0; --i) {
        gravity_object_t *context_object = (gravity_object_t *)marray_get(ctx, i);
        if (OBJECT_ISA_CLASS(context_object)) return (gravity_class_t *)context_object;
    }
    
    return NULL;
}